

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O3

void __thiscall
PrimitiveObjectsWriter::WriteLiteralString
          (PrimitiveObjectsWriter *this,string *inString,ETokenSeparator inSeparate)

{
  byte bVar1;
  IByteWriter *pIVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  byte *pbVar4;
  Byte buffer [5];
  undefined8 uStack_38;
  
  pIVar2 = this->mStreamForWriting;
  if (pIVar2 != (IByteWriter *)0x0) {
    uStack_38 = in_RAX;
    (*pIVar2->_vptr_IByteWriter[2])(pIVar2,"(",1);
    if (inString->_M_string_length != 0) {
      pbVar4 = (byte *)(inString->_M_dataplus)._M_p;
      do {
        uVar3 = uStack_38;
        bVar1 = *pbVar4;
        if ((bVar1 - 0x28 < 0x35) &&
           ((0x10000000000003U >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) != 0)) {
          uStack_38._0_4_ = CONCAT13(0x5c,(undefined3)uStack_38);
          uStack_38._5_3_ = SUB83(uVar3,5);
          uStack_38._0_5_ = CONCAT14(bVar1,(undefined4)uStack_38);
          uVar3 = 2;
        }
        else if ((byte)(bVar1 + 0x81) < 0xa1) {
          sprintf((char *)((long)&uStack_38 + 3),"\\%03o");
          uVar3 = 4;
        }
        else {
          uStack_38._0_4_ = CONCAT13(bVar1,(undefined3)uStack_38);
          uVar3 = 1;
        }
        (*this->mStreamForWriting->_vptr_IByteWriter[2])
                  (this->mStreamForWriting,(char *)((long)&uStack_38 + 3),uVar3);
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != (byte *)((inString->_M_dataplus)._M_p + inString->_M_string_length));
    }
    (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,")",1);
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteLiteralString(const std::string& inString,ETokenSeparator inSeparate)
{
	if(!mStreamForWriting)
		return;
	mStreamForWriting->Write(scLeftParanthesis,1);
	// doing some string conversion, so that charachters are written as safe ones.
	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inString.begin();
	for(;it != inString.end();++it)
	{
		Byte aValue = *it;
		if(aValue == '(' || aValue == ')' || aValue == '\\')
		{
			buffer[0] = '\\';
			buffer[1] = aValue;
			mStreamForWriting->Write(buffer,2);
		}
		else if (aValue < 32 || aValue > 126) // grabbing all nonprintable chars
		{
			SAFE_SPRINTF_1((char*)buffer,5,"\\%03o",aValue); 
			mStreamForWriting->Write(buffer,4);		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
		
	}
	mStreamForWriting->Write(scRightParanthesis,1);
	WriteTokenSeparator(inSeparate);
}